

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

ConcreteType * __thiscall
soul::PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type>
          (PoolAllocator *this,Context *args,Type *args_1)

{
  Type *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_55 [13];
  Type local_48;
  ConcreteType *local_30;
  ConcreteType *newObject;
  PoolItem *newItem;
  Type *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (Type *)args;
  args_local = (Context *)this;
  newObject = (ConcreteType *)allocateSpaceForObject(this,0x48);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  Type::Type(&local_48,(Type *)newItem);
  AST::ConcreteType::ConcreteType((ConcreteType *)this_00,(Context *)c,&local_48);
  Type::~Type(&local_48);
  local_30 = (ConcreteType *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::Type&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_55);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }